

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapcoder.c
# Opt level: O3

int getFullTerritoryNameInLocaleInAlphabetUtf8
              (char *territoryName,Territory territory,int alternative,char *locale,
              Alphabet alphabet)

{
  byte bVar1;
  __int32_t *p_Var2;
  int iVar3;
  undefined4 in_EAX;
  size_t sVar4;
  char *pcVar5;
  __int32_t **pp_Var6;
  char **ppcVar7;
  char *pcVar8;
  byte *pbVar9;
  Alphabet AVar10;
  uint uVar11;
  int iVar12;
  char cVar13;
  long lVar14;
  undefined8 uStack_38;
  
  if (0x1b < (uint)alphabet) {
    *territoryName = '\0';
    return 0;
  }
  if (((territoryName == (char *)0x0) || (alternative < 0)) ||
     ((uint)(territory + ~TERRITORY_AAA) < 0xfffffdeb)) {
    if (territoryName != (char *)0x0) {
      *territoryName = '\0';
      return 0;
    }
    return 0;
  }
  uStack_38 = CONCAT44(alternative,in_EAX);
  if (locale == (char *)0x0) {
    ppcVar7 = TERRITORY_FULL_NAME_LOCAL;
LAB_0016cb05:
    if (*ppcVar7 != (char *)0x0) goto LAB_0016cb12;
  }
  else {
    sVar4 = strlen(locale);
    uStack_38 = uStack_38 & 0xffffffff00000000;
    pcVar5 = strchr(locale,0x5f);
    if (pcVar5 == (char *)0x0) {
      pcVar5 = strchr(locale,0x2d);
    }
    iVar3 = (int)sVar4;
    if (pcVar5 != (char *)0x0) {
      iVar3 = (int)pcVar5 - (int)locale;
    }
    iVar12 = 3;
    if (iVar3 < 3) {
      iVar12 = iVar3;
    }
    memcpy(&uStack_38,locale,(long)iVar12);
    *(undefined1 *)((long)&uStack_38 + (long)iVar12) = 0;
    cVar13 = (char)uStack_38;
    if ((char)uStack_38 != '\0') {
      pp_Var6 = __ctype_toupper_loc();
      p_Var2 = *pp_Var6;
      pcVar5 = (char *)((long)&uStack_38 + 1);
      do {
        pcVar5[-1] = (char)p_Var2[cVar13];
        cVar13 = *pcVar5;
        pcVar5 = pcVar5 + 1;
      } while (cVar13 != '\0');
    }
    lVar14 = 8;
    do {
      iVar3 = strcmp(*(char **)(&UNK_0024ec08 + lVar14),(char *)&uStack_38);
      if (iVar3 == 0) {
        ppcVar7 = *(char ***)((long)&LOCALE_REGISTRY[0].locale + lVar14);
        if (ppcVar7 != (char **)0x0) goto LAB_0016cb05;
        break;
      }
      lVar14 = lVar14 + 0x10;
    } while (lVar14 != 0x1b8);
  }
  ppcVar7 = TERRITORY_FULL_NAME_EN;
LAB_0016cb12:
  *territoryName = '\0';
  pcVar5 = ppcVar7[(uint)(territory + ~_TERRITORY_MIN)];
  while (pcVar8 = strchr(pcVar5,0x7c), alphabet < ALPHABET_ROMAN) {
LAB_0016cc1d:
    if (pcVar8 == (char *)0x0) {
      if (uStack_38._4_4_ < 1) {
        strcpy(territoryName,pcVar5);
        return 1;
      }
      return 0;
    }
    if (uStack_38._4_4_ == 0) {
      iVar12 = (int)pcVar8 - (int)pcVar5;
      iVar3 = 0x6e;
      if (iVar12 < 0x6e) {
        iVar3 = iVar12;
      }
      memcpy(territoryName,pcVar5,(long)iVar3);
      territoryName[iVar3] = '\0';
      return 1;
    }
    uStack_38 = CONCAT44(uStack_38._4_4_ + -1,(undefined4)uStack_38);
    pcVar5 = pcVar8 + 1;
  }
  do {
    if (pcVar8 == (char *)0x0) {
      strcpy(territoryName,pcVar5);
    }
    else {
      iVar3 = (int)pcVar8 - (int)pcVar5;
      if (0x6d < iVar3) {
        iVar3 = 0x6e;
      }
      memcpy(territoryName,pcVar5,(long)iVar3);
      territoryName[iVar3] = '\0';
    }
    bVar1 = *territoryName;
    pbVar9 = (byte *)territoryName;
    while (bVar1 != 0) {
      if (bVar1 < 0xc0) {
        pbVar9 = pbVar9 + 1;
      }
      else {
        AVar10 = _ALPHABET_MIN;
        if (-1 < (char)pbVar9[1]) goto LAB_0016cbf4;
        uVar11 = ((uint)bVar1 * 0x40 + (pbVar9[1] & 0x3f)) - 0x3000;
        if ((int)uVar11 < 0x800) {
          pbVar9 = pbVar9 + 2;
        }
        else {
          if ((-1 < (char)pbVar9[2]) ||
             (uVar11 = (uVar11 * 0x40 + (pbVar9[2] & 0x3f)) - 0x20000, 0xffff < (int)uVar11))
          goto LAB_0016cbf4;
          pbVar9 = pbVar9 + 3;
        }
        if (""[uVar11 >> 6 & 0x3ff] != '\0') {
          AVar10 = (Alphabet)""[uVar11 >> 6 & 0x3ff];
          goto LAB_0016cbf4;
        }
      }
      bVar1 = *pbVar9;
    }
    AVar10 = ALPHABET_ROMAN;
LAB_0016cbf4:
    if (AVar10 == alphabet) goto LAB_0016cc1d;
    if (pcVar8 == (char *)0x0) {
      return 0;
    }
    pcVar5 = pcVar8 + 1;
    pcVar8 = strchr(pcVar5,0x7c);
  } while( true );
}

Assistant:

int getFullTerritoryNameInLocaleInAlphabetUtf8(char *territoryName, enum Territory territory, int alternative,
                                               const char *locale, enum Alphabet alphabet) {
    ASSERT(territoryName);
    ASSERT((_TERRITORY_MIN < territory) && (territory < _TERRITORY_MAX));
    if ((alphabet <= _ALPHABET_MIN) || (alphabet >= _ALPHABET_MAX)) {
        *territoryName = 0;
        return 0;
    }
    return getFullTerritoryName_internal(territoryName, territory, alternative, locale, alphabet);
}